

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_pass.cc
# Opt level: O0

ssize_t sock_fd_write(int sock,void *buf,ssize_t buflen,int fd)

{
  ssize_t sVar1;
  cmsghdr *cmsg;
  anon_union_24_2_2032e646 cmsgu;
  iovec iov;
  msghdr msg;
  ssize_t size;
  int fd_local;
  ssize_t buflen_local;
  void *buf_local;
  int sock_local;
  
  iov.iov_len = 0;
  iov.iov_base = (void *)buflen;
  if (fd == -1) {
    printf("not passing fd\n");
  }
  else {
    printf("passing fd %d\n",(ulong)(uint)fd);
  }
  sVar1 = sendmsg(sock,(msghdr *)&iov.iov_len,0);
  if (sVar1 < 0) {
    perror("sendmsg");
  }
  return sVar1;
}

Assistant:

ssize_t sock_fd_write(int sock, void *buf, ssize_t buflen, int fd)
{
    ssize_t size;
    struct msghdr msg;
    struct iovec iov;
    union{
        struct cmsghdr cmsghdr;
        char control[CMSG_SPACE(sizeof (int))];
    } cmsgu;
    struct cmsghdr *cmsg;

    iov.iov_base = buf;
    iov.iov_len = buflen;

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    if(fd != -1){
        msg.msg_control = cmsgu.control;
        msg.msg_controllen = sizeof(cmsgu.control);

        cmsg = CMSG_FIRSTHDR(&msg);
        cmsg->cmsg_len = CMSG_LEN(sizeof(int));
        cmsg->cmsg_level = SOL_SOCKET;
        cmsg->cmsg_type = SCM_RIGHTS;

        printf("passing fd %d\n", fd);
        *((int *) CMSG_DATA(cmsg)) = fd;
    } else {
        msg.msg_control = NULL;
        msg.msg_controllen = 0;
        printf ("not passing fd\n");
    }

    size = sendmsg(sock, &msg, 0);

    if(size < 0)
        perror("sendmsg");
    return size;

}